

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O1

int png_set_text_2(png_const_structrp png_ptr,png_inforp info_ptr,png_const_textp text_ptr,
                  int num_text)

{
  byte *pbVar1;
  uint old_elements;
  char *pcVar2;
  size_t sVar3;
  png_textp ppVar4;
  size_t __n;
  size_t __n_00;
  size_t __n_01;
  png_charp __dest;
  size_t sVar5;
  uint uVar6;
  int iVar7;
  png_charp *ppcVar8;
  long lVar9;
  size_t sVar10;
  size_t local_48;
  
  if ((((text_ptr != (png_const_textp)0x0) && (png_ptr != (png_const_structrp)0x0)) &&
      (info_ptr != (png_inforp)0x0)) && (0 < num_text)) {
    old_elements = info_ptr->num_text;
    if ((int)(info_ptr->max_text - old_elements) < num_text) {
      if ((int)(old_elements ^ 0x7fffffff) < num_text) {
        ppVar4 = (png_textp)0x0;
        uVar6 = old_elements;
      }
      else {
        uVar6 = 0x7fffffff;
        if ((int)(old_elements + num_text) < 0x7ffffff7) {
          uVar6 = (old_elements + num_text & 0xfffffff8) + 8;
        }
        ppVar4 = (png_textp)
                 png_realloc_array(png_ptr,info_ptr->text,old_elements,uVar6 - old_elements,0x38);
      }
      if (ppVar4 == (png_textp)0x0) {
        png_chunk_report(png_ptr,"too many text chunks",1);
        return 1;
      }
      png_free(png_ptr,info_ptr->text);
      info_ptr->text = ppVar4;
      pbVar1 = (byte *)((long)&info_ptr->free_me + 1);
      *pbVar1 = *pbVar1 | 0x40;
      info_ptr->max_text = uVar6;
    }
    if (0 < num_text) {
      lVar9 = 0;
      do {
        pcVar2 = *(char **)((long)&text_ptr->key + lVar9);
        sVar5 = 0;
        if (pcVar2 != (char *)0x0) {
          iVar7 = *(int *)((long)&text_ptr->compression + lVar9);
          if (iVar7 - 3U < 0xfffffffc) {
            png_chunk_report(png_ptr,"text compression mode is out of range",1);
          }
          else {
            ppVar4 = info_ptr->text + info_ptr->num_text;
            __n = strlen(pcVar2);
            if (iVar7 < 1) {
              local_48 = 0;
LAB_0011d888:
              __n_00 = 0;
            }
            else {
              pcVar2 = *(char **)((long)&text_ptr->lang + lVar9);
              if (pcVar2 == (char *)0x0) {
                local_48 = 0;
              }
              else {
                local_48 = strlen(pcVar2);
              }
              pcVar2 = *(char **)((long)&text_ptr->lang_key + lVar9);
              if (pcVar2 == (char *)0x0) goto LAB_0011d888;
              __n_00 = strlen(pcVar2);
            }
            pcVar2 = *(char **)((long)&text_ptr->text + lVar9);
            if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
              iVar7 = (uint)(0 < iVar7) * 2 + -1;
              __n_01 = 0;
            }
            else {
              __n_01 = strlen(pcVar2);
            }
            ppVar4->compression = iVar7;
            __dest = (png_charp)png_malloc_base(png_ptr,__n_01 + local_48 + __n + __n_00 + 4);
            ppVar4->key = __dest;
            if (__dest == (png_charp)0x0) {
              sVar5 = 1;
              png_chunk_report(png_ptr,"text chunk: out of memory",1);
            }
            else {
              ppcVar8 = &ppVar4->key;
              memcpy(__dest,*(void **)((long)&text_ptr->key + lVar9),__n);
              (*ppcVar8)[__n] = '\0';
              if (*(int *)((long)&text_ptr->compression + lVar9) < 1) {
                ppVar4->lang = (png_charp)0x0;
                ppVar4->lang_key = (png_charp)0x0;
              }
              else {
                ppVar4->lang = ppVar4->key + __n + 1;
                memcpy(ppVar4->key + __n + 1,*(void **)((long)&text_ptr->lang + lVar9),local_48);
                ppVar4->lang[local_48] = '\0';
                ppcVar8 = &ppVar4->lang_key;
                ppVar4->lang_key = ppVar4->lang + local_48 + 1;
                memcpy(ppVar4->lang + local_48 + 1,*(void **)((long)&text_ptr->lang_key + lVar9),
                       __n_00);
                ppVar4->lang_key[__n_00] = '\0';
                __n = __n_00;
              }
              ppVar4->text = *ppcVar8 + __n + 1;
              if (__n_01 != 0) {
                memcpy(ppVar4->text,*(void **)((long)&text_ptr->text + lVar9),__n_01);
              }
              ppVar4->text[__n_01] = '\0';
              sVar5 = 0;
              sVar10 = __n_01;
              sVar3 = sVar5;
              if (ppVar4->compression < 1) {
                sVar10 = sVar5;
                sVar3 = __n_01;
              }
              ppVar4->text_length = sVar3;
              ppVar4->itxt_length = sVar10;
              info_ptr->num_text = info_ptr->num_text + 1;
            }
          }
        }
        if (sVar5 != 0) {
          return 1;
        }
        lVar9 = lVar9 + 0x38;
      } while ((ulong)(uint)num_text * 0x38 != lVar9);
    }
  }
  return 0;
}

Assistant:

int /* PRIVATE */
png_set_text_2(png_const_structrp png_ptr, png_inforp info_ptr,
    png_const_textp text_ptr, int num_text)
{
   int i;

   png_debug1(1, "in %lx storage function", png_ptr == NULL ? 0xabadca11U :
      (unsigned long)png_ptr->chunk_name);

   if (png_ptr == NULL || info_ptr == NULL || num_text <= 0 || text_ptr == NULL)
      return(0);

   /* Make sure we have enough space in the "text" array in info_struct
    * to hold all of the incoming text_ptr objects.  This compare can't overflow
    * because max_text >= num_text (anyway, subtract of two positive integers
    * can't overflow in any case.)
    */
   if (num_text > info_ptr->max_text - info_ptr->num_text)
   {
      int old_num_text = info_ptr->num_text;
      int max_text;
      png_textp new_text = NULL;

      /* Calculate an appropriate max_text, checking for overflow. */
      max_text = old_num_text;
      if (num_text <= INT_MAX - max_text)
      {
         max_text += num_text;

         /* Round up to a multiple of 8 */
         if (max_text < INT_MAX-8)
            max_text = (max_text + 8) & ~0x7;

         else
            max_text = INT_MAX;

         /* Now allocate a new array and copy the old members in; this does all
          * the overflow checks.
          */
         new_text = png_voidcast(png_textp,png_realloc_array(png_ptr,
             info_ptr->text, old_num_text, max_text-old_num_text,
             sizeof *new_text));
      }

      if (new_text == NULL)
      {
         png_chunk_report(png_ptr, "too many text chunks",
             PNG_CHUNK_WRITE_ERROR);

         return 1;
      }

      png_free(png_ptr, info_ptr->text);

      info_ptr->text = new_text;
      info_ptr->free_me |= PNG_FREE_TEXT;
      info_ptr->max_text = max_text;
      /* num_text is adjusted below as the entries are copied in */

      png_debug1(3, "allocated %d entries for info_ptr->text", max_text);
   }

   for (i = 0; i < num_text; i++)
   {
      size_t text_length, key_len;
      size_t lang_len, lang_key_len;
      png_textp textp = &(info_ptr->text[info_ptr->num_text]);

      if (text_ptr[i].key == NULL)
          continue;

      if (text_ptr[i].compression < PNG_TEXT_COMPRESSION_NONE ||
          text_ptr[i].compression >= PNG_TEXT_COMPRESSION_LAST)
      {
         png_chunk_report(png_ptr, "text compression mode is out of range",
             PNG_CHUNK_WRITE_ERROR);
         continue;
      }

      key_len = strlen(text_ptr[i].key);

      if (text_ptr[i].compression <= 0)
      {
         lang_len = 0;
         lang_key_len = 0;
      }

      else
#  ifdef PNG_iTXt_SUPPORTED
      {
         /* Set iTXt data */

         if (text_ptr[i].lang != NULL)
            lang_len = strlen(text_ptr[i].lang);

         else
            lang_len = 0;

         if (text_ptr[i].lang_key != NULL)
            lang_key_len = strlen(text_ptr[i].lang_key);

         else
            lang_key_len = 0;
      }
#  else /* iTXt */
      {
         png_chunk_report(png_ptr, "iTXt chunk not supported",
             PNG_CHUNK_WRITE_ERROR);
         continue;
      }
#  endif

      if (text_ptr[i].text == NULL || text_ptr[i].text[0] == '\0')
      {
         text_length = 0;
#  ifdef PNG_iTXt_SUPPORTED
         if (text_ptr[i].compression > 0)
            textp->compression = PNG_ITXT_COMPRESSION_NONE;

         else
#  endif
            textp->compression = PNG_TEXT_COMPRESSION_NONE;
      }

      else
      {
         text_length = strlen(text_ptr[i].text);
         textp->compression = text_ptr[i].compression;
      }

      textp->key = png_voidcast(png_charp,png_malloc_base(png_ptr,
          key_len + text_length + lang_len + lang_key_len + 4));

      if (textp->key == NULL)
      {
         png_chunk_report(png_ptr, "text chunk: out of memory",
             PNG_CHUNK_WRITE_ERROR);

         return 1;
      }

      png_debug2(2, "Allocated %lu bytes at %p in png_set_text",
          (unsigned long)(png_uint_32)
          (key_len + lang_len + lang_key_len + text_length + 4),
          textp->key);

      memcpy(textp->key, text_ptr[i].key, key_len);
      *(textp->key + key_len) = '\0';

      if (text_ptr[i].compression > 0)
      {
         textp->lang = textp->key + key_len + 1;
         memcpy(textp->lang, text_ptr[i].lang, lang_len);
         *(textp->lang + lang_len) = '\0';
         textp->lang_key = textp->lang + lang_len + 1;
         memcpy(textp->lang_key, text_ptr[i].lang_key, lang_key_len);
         *(textp->lang_key + lang_key_len) = '\0';
         textp->text = textp->lang_key + lang_key_len + 1;
      }

      else
      {
         textp->lang=NULL;
         textp->lang_key=NULL;
         textp->text = textp->key + key_len + 1;
      }

      if (text_length != 0)
         memcpy(textp->text, text_ptr[i].text, text_length);

      *(textp->text + text_length) = '\0';

#  ifdef PNG_iTXt_SUPPORTED
      if (textp->compression > 0)
      {
         textp->text_length = 0;
         textp->itxt_length = text_length;
      }

      else
#  endif
      {
         textp->text_length = text_length;
         textp->itxt_length = 0;
      }

      info_ptr->num_text++;
      png_debug1(3, "transferred text chunk %d", info_ptr->num_text);
   }

   return(0);
}